

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeUnbind(Vdbe *p,uint i)

{
  sqlite3 *db;
  Mem *pMVar1;
  int iVar2;
  uint local_38;
  Mem *pVar;
  uint i_local;
  Vdbe *p_local;
  
  iVar2 = vdbeSafetyNotNull(p);
  if (iVar2 == 0) {
    sqlite3_mutex_enter(p->db->mutex);
    if (p->eVdbeState == '\x01') {
      if (i < (uint)(int)p->nVar) {
        pMVar1 = p->aVar;
        sqlite3VdbeMemRelease(pMVar1 + i);
        pMVar1[i].flags = 1;
        p->db->errCode = 0;
        if (p->expmask != 0) {
          if (i < 0x1f) {
            local_38 = 1 << ((byte)i & 0x1f);
          }
          else {
            local_38 = 0x80000000;
          }
          if ((p->expmask & local_38) != 0) {
            *(ushort *)&p->field_0xc8 = *(ushort *)&p->field_0xc8 & 0xfffc | 1;
          }
        }
        p_local._4_4_ = 0;
      }
      else {
        sqlite3Error(p->db,0x19);
        sqlite3_mutex_leave(p->db->mutex);
        p_local._4_4_ = 0x19;
      }
    }
    else {
      db = p->db;
      iVar2 = sqlite3MisuseError(0x16768);
      sqlite3Error(db,iVar2);
      sqlite3_mutex_leave(p->db->mutex);
      sqlite3_log(0x15,"bind on a busy prepared statement: [%s]",p->zSql);
      p_local._4_4_ = sqlite3MisuseError(0x1676c);
    }
  }
  else {
    p_local._4_4_ = sqlite3MisuseError(0x16764);
  }
  return p_local._4_4_;
}

Assistant:

static int vdbeUnbind(Vdbe *p, unsigned int i){
  Mem *pVar;
  if( vdbeSafetyNotNull(p) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(p->db->mutex);
  if( p->eVdbeState!=VDBE_READY_STATE ){
    sqlite3Error(p->db, SQLITE_MISUSE_BKPT);
    sqlite3_mutex_leave(p->db->mutex);
    sqlite3_log(SQLITE_MISUSE,
        "bind on a busy prepared statement: [%s]", p->zSql);
    return SQLITE_MISUSE_BKPT;
  }
  if( i>=(unsigned int)p->nVar ){
    sqlite3Error(p->db, SQLITE_RANGE);
    sqlite3_mutex_leave(p->db->mutex);
    return SQLITE_RANGE;
  }
  pVar = &p->aVar[i];
  sqlite3VdbeMemRelease(pVar);
  pVar->flags = MEM_Null;
  p->db->errCode = SQLITE_OK;

  /* If the bit corresponding to this variable in Vdbe.expmask is set, then
  ** binding a new value to this variable invalidates the current query plan.
  **
  ** IMPLEMENTATION-OF: R-57496-20354 If the specific value bound to a host
  ** parameter in the WHERE clause might influence the choice of query plan
  ** for a statement, then the statement will be automatically recompiled,
  ** as if there had been a schema change, on the first sqlite3_step() call
  ** following any change to the bindings of that parameter.
  */
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask!=0 && (p->expmask & (i>=31 ? 0x80000000 : (u32)1<<i))!=0 ){
    p->expired = 1;
  }
  return SQLITE_OK;
}